

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_NtkPrintStats(Cba_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  Cba_Ntk_t *p_00;
  char *pcVar3;
  Cba_Ntk_t *p_local;
  
  uVar1 = Cba_NtkPiNum(p);
  printf("pi =%5d  ",(ulong)uVar1);
  uVar1 = Cba_NtkPoNum(p);
  printf("po =%5d  ",(ulong)uVar1);
  uVar1 = Cba_NtkBoxSeqNum(p);
  printf("seq =%5d  ",(ulong)uVar1);
  uVar1 = Cba_NtkBoxNum(p);
  printf("box =%5d  ",(ulong)uVar1);
  uVar1 = Cba_NtkBoxPrimNum(p);
  printf("prim =%5d  ",(ulong)uVar1);
  uVar1 = Cba_NtkBoxUserNum(p);
  printf("user =%5d  ",(ulong)uVar1);
  Cba_NtkName(p);
  printf("  %s ");
  iVar2 = Vec_IntSize(&p->vNtkObjs);
  if (iVar2 != 0) {
    iVar2 = Vec_IntEntry(&p->vNtkObjs,0);
    p_00 = Cba_NtkNtk(p,iVar2);
    pcVar3 = Cba_NtkName(p_00);
    printf("-> %s",pcVar3);
  }
  printf("\n");
  return;
}

Assistant:

static inline void Cba_NtkPrintStats( Cba_Ntk_t * p )
{
    printf( "pi =%5d  ",   Cba_NtkPiNum(p) );
    printf( "po =%5d  ",   Cba_NtkPoNum(p) );
    printf( "seq =%5d  ",  Cba_NtkBoxSeqNum(p) );
    printf( "box =%5d  ",  Cba_NtkBoxNum(p) );
    printf( "prim =%5d  ", Cba_NtkBoxPrimNum(p) );
    printf( "user =%5d  ", Cba_NtkBoxUserNum(p) );
    //printf( "topo =%4s  ", Cba_NtkIsTopoOrder(p) ? "yes" : "no" );
    printf( "  %s ",       Cba_NtkName(p) );
    if ( Vec_IntSize(&p->vNtkObjs) )
        printf( "-> %s",   Cba_NtkName(Cba_NtkNtk(p, Vec_IntEntry(&p->vNtkObjs, 0))) );
    printf( "\n" );
//    Vec_StrIntPrint( &p->vObjType );
}